

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       parse_width<char,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
                 *handler)

{
  uint uVar1;
  char *begin_00;
  char *local_28;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
  local_20;
  
  local_28 = begin;
  if ((byte)(*begin - 0x30U) < 10) {
    uVar1 = parse_nonnegative_int<char,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                      (&local_28,end,handler);
    (((handler->
      super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
      ).super_specs_setter<char>.specs_)->super_align_spec).width_ = uVar1;
    begin_00 = local_28;
  }
  else {
    begin_00 = begin;
    if (*begin == '{') {
      begin_00 = begin + 1;
      if (begin_00 != end) {
        local_20.handler = handler;
        begin_00 = parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>>
                             (begin_00,end,&local_20);
      }
      if ((begin_00 == end) || (*begin_00 != '}')) {
        dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
        ::on_error(&handler->
                    super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                   ,"invalid format string");
      }
      else {
        begin_00 = begin_00 + 1;
      }
    }
  }
  return begin_00;
}

Assistant:

FMT_CONSTEXPR const Char *parse_width(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}